

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

bool __thiscall
FNodeBuilder::CheckSubsectorOverlappingSegs
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg)

{
  FPrivSeg *pFVar1;
  uint uVar2;
  FPrivSeg *pFVar3;
  bool bVar4;
  uint seg;
  ulong uVar5;
  DWORD mate;
  
  pFVar3 = (this->Segs).Array;
  mate = set;
  do {
    if (mate == 0xffffffff) {
      return false;
    }
    uVar5 = (ulong)mate;
    pFVar1 = pFVar3 + uVar5;
    if (pFVar3[uVar5].linedef != -1) {
      while( true ) {
        uVar2 = pFVar3[uVar5].next;
        uVar5 = (ulong)uVar2;
        if (uVar5 == 0xffffffff) break;
        if ((pFVar3[uVar5].v1 == pFVar1->v1) && (pFVar3[uVar5].v2 == pFVar1->v2)) {
          seg = uVar2;
          if (pFVar3[uVar5].linedef == -1) {
            seg = mate;
            mate = uVar2;
          }
          *splitseg = 0xffffffff;
          bVar4 = ShoveSegBehind(this,set,node,seg,mate);
          return bVar4;
        }
      }
    }
    mate = pFVar1->next;
  } while( true );
}

Assistant:

bool FNodeBuilder::CheckSubsectorOverlappingSegs (DWORD set, node_t &node, DWORD &splitseg)
{
	int v1, v2;
	DWORD seg1, seg2;

	for (seg1 = set; seg1 != DWORD_MAX; seg1 = Segs[seg1].next)
	{
		if (Segs[seg1].linedef == -1)
		{ // Do not check minisegs.
			continue;
		}
		v1 = Segs[seg1].v1;
		v2 = Segs[seg1].v2;
		for (seg2 = Segs[seg1].next; seg2 != DWORD_MAX; seg2 = Segs[seg2].next)
		{
			if (Segs[seg2].v1 == v1 && Segs[seg2].v2 == v2)
			{
				if (Segs[seg2].linedef == -1)
				{ // Do not put minisegs into a new subsector.
					swapvalues (seg1, seg2);
				}
				D(Printf(PRINT_LOG, "Need to synthesize a splitter for set %d on seg %d (ov)\n", set, seg2));
				splitseg = DWORD_MAX;

				return ShoveSegBehind (set, node, seg2, seg1);
			}
		}
	}
	// It really is a good subsector.
	return false;
}